

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void __thiscall
google::protobuf::internal::
KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
InsertUnique(KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *this,map_index_t b,KeyNode *node)

{
  uint uVar1;
  NodeBase **ppNVar2;
  bool bVar3;
  char *failure_msg;
  int line;
  NodeAndBucket NVar4;
  ViewType k;
  LogMessageFatal LStack_38;
  
  uVar1 = (this->super_UntypedMapBase).index_of_first_non_null_;
  if ((uVar1 == (this->super_UntypedMapBase).num_buckets_) ||
     ((this->super_UntypedMapBase).table_[uVar1] != (NodeBase *)0x0)) {
    k._M_str = (char *)node[1].super_NodeBase.next;
    k._M_len = (size_t)node[2].super_NodeBase.next;
    NVar4 = FindHelper(this,k);
    if (NVar4.node == (NodeBase *)0x0) {
      AssertLoadFactor(this);
      ppNVar2 = (this->super_UntypedMapBase).table_;
      if (ppNVar2[b] == (NodeBase *)0x0) {
        ppNVar2[b] = &node->super_NodeBase;
        (node->super_NodeBase).next = (NodeBase *)0x0;
        uVar1 = (this->super_UntypedMapBase).index_of_first_non_null_;
        if (uVar1 < b) {
          b = uVar1;
        }
        (this->super_UntypedMapBase).index_of_first_non_null_ = b;
      }
      else {
        bVar3 = UntypedMapBase::ShouldInsertAfterHead(&this->super_UntypedMapBase,node);
        if (bVar3) {
          (node->super_NodeBase).next = ppNVar2[b]->next;
          ppNVar2[b]->next = &node->super_NodeBase;
        }
        else {
          (node->super_NodeBase).next = ppNVar2[b];
          ppNVar2[b] = &node->super_NodeBase;
        }
      }
      return;
    }
    failure_msg = "FindHelper(TS::ToView(node->key())).node == nullptr";
    line = 0x315;
  }
  else {
    failure_msg = 
    "index_of_first_non_null_ == num_buckets_ || table_[index_of_first_non_null_] != nullptr";
    line = 0x310;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&LStack_38,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_38);
}

Assistant:

void InsertUnique(map_index_t b, KeyNode* node) {
    ABSL_DCHECK(index_of_first_non_null_ == num_buckets_ ||
                table_[index_of_first_non_null_] != nullptr);
    // In practice, the code that led to this point may have already
    // determined whether we are inserting into an empty list, a short list,
    // or whatever.  But it's probably cheap enough to recompute that here;
    // it's likely that we're inserting into an empty or short list.
    ABSL_DCHECK(FindHelper(TS::ToView(node->key())).node == nullptr);
    AssertLoadFactor();
    auto*& head = table_[b];
    if (head == nullptr) {
      head = node;
      node->next = nullptr;
      index_of_first_non_null_ = (std::min)(index_of_first_non_null_, b);
    } else if (ShouldInsertAfterHead(node)) {
      node->next = head->next;
      head->next = node;
    } else {
      node->next = head;
      head = node;
    }
  }